

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

string * google::protobuf::compiler::anon_unknown_4::PluginName
                   (string *__return_storage_ptr__,string *plugin_prefix,string *directive)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  pcVar2 = (plugin_prefix->_M_dataplus)._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + plugin_prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_60);
  std::__cxx11::string::substr((ulong)&local_40,(ulong)directive);
  uVar5 = 0xf;
  if (local_60 != local_50) {
    uVar5 = local_50[0];
  }
  if (uVar5 < (ulong)(local_38 + local_58)) {
    uVar5 = 0xf;
    if (local_40 != local_30) {
      uVar5 = local_30[0];
    }
    if ((ulong)(local_38 + local_58) <= uVar5) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)local_60);
      goto LAB_00227205;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40);
LAB_00227205:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar3 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

string PluginName(const std::string& plugin_prefix,
                  const std::string& directive) {
  // Assuming the directive starts with "--" and ends with "_out" or "_opt",
  // strip the "--" and "_out/_opt" and add the plugin prefix.
  return plugin_prefix + "gen-" + directive.substr(2, directive.size() - 6);
}